

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noisy_laser_tag.cpp
# Opt level: O2

void __thiscall despot::NoisyLaserTag::Init(NoisyLaserTag *this)

{
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *this_00;
  double dVar1;
  int iVar2;
  long lVar3;
  int i;
  OBS_TYPE dir;
  long lVar4;
  double dVar5;
  ulong extraout_XMM0_Qb;
  double dVar6;
  double prob;
  double local_58;
  ulong uStack_50;
  double local_48;
  
  for (dir = 0; (long)dir < (long)NBEAMS; dir = dir + 1) {
    SetReading(&(this->super_BaseTag).same_loc_obs_,0x65,dir);
  }
  this_00 = &this->reading_distributions_;
  iVar2 = (**(code **)(*(long *)&this->super_BaseTag + 0x10))(this);
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::resize(this_00,(long)iVar2);
  lVar4 = 0;
  while( true ) {
    iVar2 = (**(code **)(*(long *)&this->super_BaseTag + 0x10))(this);
    if (iVar2 <= lVar4) break;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize((this_00->
             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + lVar4,(long)NBEAMS);
    for (lVar3 = 0; lVar3 < NBEAMS; lVar3 = lVar3 + 1) {
      local_48 = LaserRange(this,&(this->super_BaseTag).states_.
                                  super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar4]->super_State,
                            (int)lVar3);
      local_58 = -local_48;
      uStack_50 = extraout_XMM0_Qb ^ 0x8000000000000000;
      iVar2 = 0;
      while( true ) {
        dVar1 = this->unit_size_;
        if (local_48 / dVar1 <= (double)iVar2) break;
        dVar5 = (double)(iVar2 + 1) * dVar1;
        if (local_48 <= dVar5) {
          dVar5 = local_48;
        }
        dVar5 = (double)despot::gausscdf(dVar5 - local_48,0.0,this->noise_sigma_);
        dVar6 = 0.0;
        if (iVar2 != 0) {
          dVar6 = (double)despot::gausscdf((double)iVar2 * dVar1 + local_58,0.0,this->noise_sigma_);
        }
        prob = (dVar5 - dVar6) + (dVar5 - dVar6);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)
                   (*(long *)&(this_00->
                              super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[lVar4].
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data + lVar3 * 0x18),&prob);
        iVar2 = iVar2 + 1;
      }
    }
    lVar4 = lVar4 + 1;
  }
  return;
}

Assistant:

void NoisyLaserTag::Init() {
	for (int i = 0; i < NBEAMS; i++)
		SetReading(same_loc_obs_, 101, i);

	reading_distributions_.resize(NumStates());

	for (int s = 0; s < NumStates(); s++) {
		reading_distributions_[s].resize(NBEAMS);

		for (int d = 0; d < NBEAMS; d++) {
			double dist = LaserRange(*states_[s], d);
			for (int reading = 0; reading < dist / unit_size_; reading++) {
				double min_noise = reading * unit_size_ - dist;
				double max_noise = min(dist, (reading + 1) * unit_size_) - dist;
				double prob =
					2
						* (gausscdf(max_noise, 0, noise_sigma_)
							- (reading > 0 ?
								gausscdf(min_noise, 0, noise_sigma_) : 0 /*min_noise = -infty*/));

				reading_distributions_[s][d].push_back(prob);
			}
		}
	}
}